

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraph_p.h
# Opt level: O3

AnchorData * __thiscall
Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::takeEdge
          (Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this,
          AnchorVertex *first,AnchorVertex *second)

{
  AnchorData *pAVar1;
  
  pAVar1 = edgeData(this,first,second);
  if (pAVar1 != (AnchorData *)0x0) {
    removeDirectedEdge(this,first,second);
    removeDirectedEdge(this,second,first);
  }
  return pAVar1;
}

Assistant:

EdgeData *takeEdge(Vertex* first, Vertex* second)
    {
#if defined(QT_DEBUG) && 0
        qDebug("Graph::takeEdge(): %s",
               qPrintable(QString::fromLatin1("%1-%2")
                          .arg(first->toString()).arg(second->toString())));
#endif
        // Removes a bidirectional edge
        EdgeData *data = edgeData(first, second);
        if (data) {
            removeDirectedEdge(first, second);
            removeDirectedEdge(second, first);
        }
        return data;
    }